

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O0

string * ZXing::OneD::DataBar::DecodeCompressedGTIN(string *prefix,BitArrayView *bits)

{
  string *in_RSI;
  string *in_RDI;
  int in_stack_00000018;
  int in_stack_0000001c;
  int i;
  int in_stack_ffffffffffffff5c;
  BitArrayView *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    BitArrayView::readBits(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    in_stack_ffffffffffffff70 = &local_40;
    ToString<int,void>(in_stack_0000001c,in_stack_00000018);
    std::__cxx11::string::append(in_RSI);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::substr((ulong)local_70,(ulong)in_RSI);
  GTIN::ComputeCheckDigit<char>(in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  std::__cxx11::string::push_back((char)in_RSI);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

static std::string DecodeCompressedGTIN(std::string prefix, BitArrayView& bits)
{
	for (int i = 0; i < 4; ++i)
		prefix.append(ToString(bits.readBits(10), 3));

	prefix.push_back(GTIN::ComputeCheckDigit(prefix.substr(2)));

	return prefix;
}